

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

void __thiscall
qpdf::Array::setFromVector
          (Array *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v)

{
  bool bVar1;
  QPDF_Array *pQVar2;
  size_type __n;
  reference item_00;
  QPDFObjectHandle *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  QPDF_Array *a;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v_local;
  Array *this_local;
  
  pQVar2 = array(this);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::resize(&pQVar2->elements,0);
  __n = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(v);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve(&pQVar2->elements,__n);
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(v);
  item = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(v);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&item);
    if (!bVar1) break;
    item_00 = __gnu_cxx::
              __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
              ::operator*(&__end1);
    checkOwnership(this,item_00);
    std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
    emplace_back<QPDFObjectHandle_const&>
              ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&pQVar2->elements,
               item_00);
    __gnu_cxx::
    __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void
Array::setFromVector(std::vector<QPDFObjectHandle> const& v)
{
    auto a = array();
    a->elements.resize(0);
    a->elements.reserve(v.size());
    for (auto const& item: v) {
        checkOwnership(item);
        a->elements.emplace_back(item);
    }
}